

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O1

shared_ptr<const_tchecker::typed_statement_t> __thiscall
tchecker::typed_if_statement_t::then_stmt_ptr(typed_if_statement_t *this)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  long in_RSI;
  undefined1 auVar2 [16];
  shared_ptr<const_tchecker::typed_statement_t> sVar3;
  
  if (*(long *)(in_RSI + 0x28) == 0) {
    lVar1 = 0;
  }
  else {
    auVar2 = __dynamic_cast(*(long *)(in_RSI + 0x28),&statement_t::typeinfo,
                            &typed_statement_t::typeinfo,0xffffffffffffffff);
    in_RDX._M_pi = auVar2._8_8_;
    lVar1 = auVar2._0_8_;
  }
  if (lVar1 == 0) {
    *(undefined8 *)&this->super_typed_statement_t = 0;
    *(undefined8 *)&(this->super_typed_statement_t)._type = 0;
  }
  else {
    *(long *)&this->super_typed_statement_t = lVar1;
    lVar1 = *(long *)(in_RSI + 0x30);
    *(long *)&(this->super_typed_statement_t)._type = lVar1;
    if (lVar1 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
      }
    }
  }
  sVar3.super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = in_RDX._M_pi;
  sVar3.super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_typed_statement_t;
  return (shared_ptr<const_tchecker::typed_statement_t>)
         sVar3.super___shared_ptr<const_tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<tchecker::typed_statement_t const> typed_if_statement_t::then_stmt_ptr() const
{
  return std::dynamic_pointer_cast<tchecker::typed_statement_t const>(tchecker::if_statement_t::then_stmt_ptr());
}